

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O2

int register_leap_second(double leap_second)

{
  size_t __size;
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar4 = __tls_get_addr(&PTR_001d8d10);
  iVar2 = *(int *)(lVar4 + 0x1130);
  uVar7 = (ulong)iVar2;
  if ((uVar7 & 0xf) == 0) {
    __size = uVar7 * 8 + 0x80;
    pvVar5 = realloc(*(void **)(lVar4 + 0x1128),__size);
    if (pvVar5 == (void *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",__size,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                     ,0x261);
      return -1;
    }
    *(void **)(lVar4 + 0x1128) = pvVar5;
  }
  if ((0 < iVar2) &&
     (lVar3 = *(long *)(lVar4 + 0x1128), leap_second <= *(double *)(lVar3 + -8 + uVar7 * 8))) {
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = *(double *)(lVar3 + uVar6 * 8);
      if (leap_second <= dVar1) {
        if ((leap_second == dVar1) && (!NAN(leap_second) && !NAN(dVar1))) {
          return 0;
        }
        *(double *)(lVar3 + uVar6 * 8) = leap_second;
        leap_second = dVar1;
      }
    }
  }
  *(double *)(*(long *)(lVar4 + 0x1128) + uVar7 * 8) = leap_second;
  *(int *)(lVar4 + 0x1130) = iVar2 + 1;
  return 0;
}

Assistant:

static int register_leap_second(double leap_second)
{
    int i;

    if (num_leap_seconds % BLOCK_SIZE == 0)
    {
        double *new_leap_second_table;

        new_leap_second_table = realloc(leap_second_table, (num_leap_seconds + BLOCK_SIZE) * sizeof(double));
        if (new_leap_second_table == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (num_leap_seconds + BLOCK_SIZE) * sizeof(double), __FILE__, __LINE__);
            return -1;
        }
        leap_second_table = new_leap_second_table;
    }
    if (num_leap_seconds > 0 && leap_second <= leap_second_table[num_leap_seconds - 1])
    {
        /* do sorted insert */
        for (i = 0; i < num_leap_seconds; i++)
        {
            if (leap_second <= leap_second_table[i])
            {
                double tmp;

                if (leap_second == leap_second_table[i])
                {
                    /* ignore double leap_second entries */
                    return 0;
                }
                tmp = leap_second_table[i];
                leap_second_table[i] = leap_second;
                leap_second = tmp;
            }
        }
    }
    leap_second_table[num_leap_seconds] = leap_second;
    num_leap_seconds++;

    return 0;
}